

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3PendingTermsDocid(Fts3Table *p,int bDelete,int iLangid,sqlite_int64 iDocid)

{
  Fts3Table *in_RCX;
  int in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  int rc;
  int local_4;
  
  if ((((*(long *)(in_RDI + 0x200) <= (long)in_RCX) &&
       (((in_RCX != *(Fts3Table **)(in_RDI + 0x200) || (*(int *)(in_RDI + 0x20c) != 0)) &&
        (*(int *)(in_RDI + 0x208) == in_EDX)))) &&
      (*(int *)(in_RDI + 0x1fc) <= *(int *)(in_RDI + 0x1f8))) ||
     (local_4 = sqlite3Fts3PendingTermsFlush(in_RCX), local_4 == 0)) {
    *(Fts3Table **)(in_RDI + 0x200) = in_RCX;
    *(int *)(in_RDI + 0x208) = in_EDX;
    *(undefined4 *)(in_RDI + 0x20c) = in_ESI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int fts3PendingTermsDocid(
  Fts3Table *p,                   /* Full-text table handle */
  int bDelete,                    /* True if this op is a delete */
  int iLangid,                    /* Language id of row being written */
  sqlite_int64 iDocid             /* Docid of row being written */
){
  assert( iLangid>=0 );
  assert( bDelete==1 || bDelete==0 );

  /* TODO(shess) Explore whether partially flushing the buffer on
  ** forced-flush would provide better performance.  I suspect that if
  ** we ordered the doclists by size and flushed the largest until the
  ** buffer was half empty, that would let the less frequent terms
  ** generate longer doclists.
  */
  if( iDocid<p->iPrevDocid
   || (iDocid==p->iPrevDocid && p->bPrevDelete==0)
   || p->iPrevLangid!=iLangid
   || p->nPendingData>p->nMaxPendingData
  ){
    int rc = sqlite3Fts3PendingTermsFlush(p);
    if( rc!=SQLITE_OK ) return rc;
  }
  p->iPrevDocid = iDocid;
  p->iPrevLangid = iLangid;
  p->bPrevDelete = bDelete;
  return SQLITE_OK;
}